

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O3

void __thiscall QTuioHandler::process2DObjFseq(QTuioHandler *this,QOscMessage *message)

{
  QWindow *win;
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  long lVar3;
  byte bVar4;
  undefined8 *puVar5;
  TouchPoint *pTVar6;
  QTuioToken *t;
  _Rb_tree_node_base *p_Var7;
  QTuioToken *tc;
  long in_FS_OFFSET;
  byte bVar8;
  add_const_t<QList<QTuioToken>_> *__range1;
  TouchPoint tp;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> local_c8;
  QArrayData *local_b0;
  long *local_a8;
  qreal local_a0;
  State local_60;
  QVector2D local_5c;
  QArrayData *local_50;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  win = (QWindow *)QGuiApplication::focusWindow();
  if (win == (QWindow *)0x0) {
    QGuiApplication::topLevelWindows();
    bVar4 = local_a0 != 0.0 & forceDelivery;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,8,0x10);
      }
    }
    if (bVar4 == 0) goto LAB_0010b546;
    QGuiApplication::topLevelWindows();
    win = (QWindow *)*local_a8;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,8,0x10);
      }
    }
    if (win == (QWindow *)0x0) goto LAB_0010b546;
  }
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (TouchPoint *)0x0;
  local_c8.size = 0;
  if (*(long *)(this + 0x48) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)(*(long *)(this + 0x48) + 0x30);
  }
  QList<QWindowSystemInterface::TouchPoint>::reserve
            ((QList<QWindowSystemInterface::TouchPoint> *)&local_c8,lVar2 + *(long *)(this + 0x60));
  lVar2 = *(long *)(this + 0x48);
  if (lVar2 == 0) {
    p_Var1 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var1 = *(_Rb_tree_node_base **)(lVar2 + 0x20);
  }
  p_Var7 = (_Rb_tree_node_base *)(lVar2 + 0x10);
  if (lVar2 == 0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var1 != p_Var7) {
    do {
      puVar5 = &DAT_00110530;
      pTVar6 = (TouchPoint *)&local_b0;
      for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined8 *)pTVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        pTVar6 = (TouchPoint *)((long)pTVar6 + (ulong)bVar8 * -0x10 + 8);
      }
      tokenToTouchPoint((TouchPoint *)&local_b0,this,(QTuioToken *)&p_Var1[1].field_0x4,win);
      QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::
      emplace<QWindowSystemInterface::TouchPoint_const&>
                ((QGenericArrayOps<QWindowSystemInterface::TouchPoint> *)&local_c8,local_c8.size,
                 (TouchPoint *)&local_b0);
      QList<QWindowSystemInterface::TouchPoint>::end
                ((QList<QWindowSystemInterface::TouchPoint> *)&local_c8);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,0x10,0x10);
        }
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != p_Var7);
  }
  if (*(long *)(this + 0x60) != 0) {
    tc = *(QTuioToken **)(this + 0x58);
    lVar2 = *(long *)(this + 0x60) * 0x2c;
    do {
      puVar5 = &DAT_00110530;
      pTVar6 = (TouchPoint *)&local_b0;
      for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)pTVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        pTVar6 = (TouchPoint *)((long)pTVar6 + (ulong)bVar8 * -0x10 + 8);
      }
      tokenToTouchPoint((TouchPoint *)&local_b0,this,tc,win);
      local_60 = Released;
      local_5c.v[0] = 0.0;
      local_5c.v[1] = 0.0;
      QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::
      emplace<QWindowSystemInterface::TouchPoint_const&>
                ((QGenericArrayOps<QWindowSystemInterface::TouchPoint> *)&local_c8,local_c8.size,
                 (TouchPoint *)&local_b0);
      QList<QWindowSystemInterface::TouchPoint>::end
                ((QList<QWindowSystemInterface::TouchPoint> *)&local_c8);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,0x10,0x10);
        }
      }
      tc = tc + 1;
      lVar2 = lVar2 + -0x2c;
    } while (lVar2 != 0);
  }
  QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::DefaultDelivery>
            (win,*(undefined8 *)(this + 0x10),&local_c8,0);
  QList<QTuioToken>::clear((QList<QTuioToken> *)(this + 0x50));
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::~QArrayDataPointer(&local_c8);
LAB_0010b546:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTuioHandler::process2DObjFseq(const QOscMessage &message)
{
    Q_UNUSED(message); // TODO: do we need to do anything with the frame id?

    QWindow *win = QGuiApplication::focusWindow();
    if (!win && QGuiApplication::topLevelWindows().size() > 0 && forceDelivery)
          win = QGuiApplication::topLevelWindows().at(0);

    if (!win)
        return;

    QList<QWindowSystemInterface::TouchPoint> tpl;
    tpl.reserve(m_activeTokens.size() + m_deadTokens.size());

    for (const QTuioToken & t : std::as_const(m_activeTokens)) {
        QWindowSystemInterface::TouchPoint tp = tokenToTouchPoint(t, win);
        tpl.append(tp);
    }

    for (const QTuioToken & t : std::as_const(m_deadTokens)) {
        QWindowSystemInterface::TouchPoint tp = tokenToTouchPoint(t, win);
        tp.state = QEventPoint::State::Released;
        tp.velocity = QVector2D();
        tpl.append(tp);
    }
    QWindowSystemInterface::handleTouchEvent(win, m_device, tpl);

    m_deadTokens.clear();
}